

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O1

void duckdb::RadixScatterListVector
               (Vector *v,UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t width,idx_t offset)

{
  data_ptr_t *ppdVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  uint64_t uVar6;
  list_entry_t *plVar7;
  Vector *this;
  idx_t count;
  size_t sVar8;
  SelectionVector *pSVar9;
  byte *pbVar10;
  idx_t iVar11;
  ulong uVar12;
  idx_t iVar13;
  byte *pbVar14;
  
  plVar7 = ListVector::GetData(v);
  this = ListVector::GetEntry(v);
  count = ListVector::GetListSize(v);
  Vector::Flatten(this,count);
  if (has_null) {
    if (add_count != 0) {
      sVar8 = width - 2;
      iVar13 = 0;
      do {
        iVar11 = iVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar13];
        }
        psVar2 = vdata->sel->sel_vector;
        if (psVar2 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar2[iVar11];
        }
        uVar12 = iVar11 + offset;
        ppdVar1 = key_locations + iVar13;
        pdVar3 = *ppdVar1;
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
        {
          pbVar14 = pdVar3 + 1;
          *ppdVar1 = pbVar14;
          *pdVar3 = nulls_first;
          pdVar5 = *ppdVar1;
          uVar6 = plVar7[uVar12].length;
          *ppdVar1 = pdVar5 + 1;
          if (uVar6 == 0) {
            *pdVar5 = '\0';
            switchD_00570541::default(*ppdVar1,0,sVar8);
            *ppdVar1 = *ppdVar1 + sVar8;
          }
          else {
            *pdVar5 = '\x01';
            pSVar9 = FlatVector::IncrementalSelectionVector();
            RowOperations::RadixScatter
                      (this,count,pSVar9,1,ppdVar1,false,true,false,prefix_len,sVar8,
                       plVar7[uVar12].offset);
          }
          if ((desc) && (*ppdVar1 = pbVar14, 1 < (long)width)) {
            do {
              *pbVar14 = ~*pbVar14;
              pbVar14 = *ppdVar1 + 1;
              *ppdVar1 = pbVar14;
            } while (pbVar14 < pdVar3 + width);
          }
        }
        else {
          *ppdVar1 = pdVar3 + 1;
          *pdVar3 = !nulls_first;
          switchD_00570541::default(*ppdVar1,0,width - 1);
          *ppdVar1 = *ppdVar1 + (width - 1);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != add_count);
    }
  }
  else if (add_count != 0) {
    sVar8 = width - 1;
    iVar13 = 0;
    do {
      iVar11 = iVar13;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)sel->sel_vector[iVar13];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar2[iVar11];
      }
      ppdVar1 = key_locations + iVar13;
      pbVar14 = *ppdVar1;
      uVar6 = plVar7[offset + iVar11].length;
      *ppdVar1 = pbVar14 + 1;
      if (uVar6 == 0) {
        *pbVar14 = 0;
        switchD_00570541::default(*ppdVar1,0,sVar8);
        *ppdVar1 = *ppdVar1 + sVar8;
      }
      else {
        *pbVar14 = 1;
        pSVar9 = FlatVector::IncrementalSelectionVector();
        RowOperations::RadixScatter
                  (this,count,pSVar9,1,ppdVar1,false,true,false,prefix_len,sVar8,
                   plVar7[offset + iVar11].offset);
      }
      if ((desc) && (*ppdVar1 = pbVar14, 0 < (long)width)) {
        pbVar10 = pbVar14 + width;
        do {
          *pbVar14 = ~*pbVar14;
          pbVar14 = *ppdVar1 + 1;
          *ppdVar1 = pbVar14;
        } while (pbVar14 < pbVar10);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != add_count);
  }
  return;
}

Assistant:

void RadixScatterListVector(Vector &v, UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                            data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                            const idx_t prefix_len, const idx_t width, const idx_t offset) {
	auto list_data = ListVector::GetData(v);
	auto &child_vector = ListVector::GetEntry(v);
	auto list_size = ListVector::GetListSize(v);
	child_vector.Flatten(list_size);

	// serialize null values
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				*key_location++ = valid;
				auto &list_entry = list_data[source_idx];
				if (list_entry.length > 0) {
					// denote that the list is not empty with a 1
					*key_location++ = 1;
					RowOperations::RadixScatter(child_vector, list_size, *FlatVector::IncrementalSelectionVector(), 1,
					                            key_locations + i, false, true, false, prefix_len, width - 2,
					                            list_entry.offset);
				} else {
					// denote that the list is empty with a 0
					*key_location++ = 0;
					// mark rest of bits as empty
					memset(key_location, '\0', width - 2);
					key_location += width - 2;
				}
				// invert bits if desc
				if (desc) {
					// skip over validity byte, handled by nulls first/last
					for (key_location = key_location_start + 1; key_location < key_location_start + width;
					     key_location++) {
						*key_location = ~*key_location;
					}
				}
			} else {
				*key_location++ = invalid;
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			auto &list_entry = list_data[source_idx];
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;
			if (list_entry.length > 0) {
				// denote that the list is not empty with a 1
				*key_location++ = 1;
				RowOperations::RadixScatter(child_vector, list_size, *FlatVector::IncrementalSelectionVector(), 1,
				                            key_locations + i, false, true, false, prefix_len, width - 1,
				                            list_entry.offset);
			} else {
				// denote that the list is empty with a 0
				*key_location++ = 0;
				// mark rest of bits as empty
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			// invert bits if desc
			if (desc) {
				for (key_location = key_location_start; key_location < key_location_start + width; key_location++) {
					*key_location = ~*key_location;
				}
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	}
}